

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O0

void test_extract_ctx(void)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bson_t *bson_00;
  int32_t *piVar7;
  int32_t *piVar8;
  int32_t *piVar9;
  undefined8 in_stack_ffffffffffffff40;
  undefined4 uVar10;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 uVar13;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar14;
  bson_t *bson;
  int local_28;
  int32_t c;
  int32_t b;
  int32_t a;
  
  uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  uVar4 = bson_bcon_magic();
  iVar1 = bcon_ensure_int32(1);
  uVar5 = bson_bcon_magic();
  iVar2 = bcon_ensure_int32(2);
  uVar6 = bson_bcon_magic();
  iVar3 = bcon_ensure_int32(3);
  uVar12 = 0;
  bson_00 = (bson_t *)
            bcon_new(0,"a",uVar4,0xf,iVar1,"b",uVar5,CONCAT44(uVar10,0xf),CONCAT44(uVar11,iVar2),"c"
                     ,uVar6,CONCAT44(uVar13,0xf),CONCAT44(uVar14,iVar3),0);
  uVar4 = bson_bcone_magic();
  piVar7 = bcon_ensure_int32_ptr(&c);
  uVar5 = bson_bcone_magic();
  piVar8 = bcon_ensure_int32_ptr(&local_28);
  uVar6 = bson_bcone_magic();
  piVar9 = bcon_ensure_int32_ptr((int32_t *)((long)&bson + 4));
  test_extract_ctx_helper
            (bson_00,3,"a",uVar4,0xf,piVar7,0,"b",uVar5,CONCAT44(uVar12,0xf),piVar8,0,"c",uVar6,0xf,
             piVar9,0);
  if (c != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x197,"test_extract_ctx","a == 1");
    abort();
  }
  if (local_28 != 2) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x198,"test_extract_ctx","b == 2");
    abort();
  }
  if (bson._4_4_ != 3) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0x199,"test_extract_ctx","c == 3");
    abort();
  }
  bson_destroy(bson_00);
  return;
}

Assistant:

static void
test_extract_ctx (void)
{
   int32_t a, b, c;

   bson_t *bson =
      BCON_NEW ("a", BCON_INT32 (1), "b", BCON_INT32 (2), "c", BCON_INT32 (3));

   test_extract_ctx_helper (bson,
                            3,
                            "a",
                            BCONE_INT32 (a),
                            NULL,
                            "b",
                            BCONE_INT32 (b),
                            NULL,
                            "c",
                            BCONE_INT32 (c),
                            NULL);

   BSON_ASSERT (a == 1);
   BSON_ASSERT (b == 2);
   BSON_ASSERT (c == 3);

   bson_destroy (bson);
}